

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O2

void __thiscall bandit::reporter::info::context_ended(info *this,string *desc)

{
  context_info *pcVar1;
  _Elt_pointer pcVar2;
  size_type sVar3;
  _Elt_pointer pcVar4;
  _Elt_pointer pcVar5;
  _Elt_pointer pcVar6;
  context_info context;
  context_info local_40;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(&(this->super_colored_base).super_progress_base.contexts_);
  sVar3 = std::
          deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
          ::size(&(this->context_stack_).c);
  if (sVar3 != 1) {
    pcVar6 = (this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pcVar4 = (this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    if (pcVar6 == pcVar4) {
      pcVar1 = (this->context_stack_).c.
               super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
      pcVar2 = pcVar1 + 9;
      pcVar5 = pcVar1 + 10;
    }
    else {
      pcVar2 = pcVar6 + -1;
      pcVar5 = pcVar6;
    }
    if (pcVar2->total <= pcVar5[-1].skipped) goto LAB_00108b88;
  }
  output_context_end_message(this);
  pcVar6 = (this->context_stack_).c.
           super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pcVar4 = (this->context_stack_).c.
           super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_00108b88:
  if (pcVar6 == pcVar4) {
    pcVar6 = (this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
  }
  context_info::context_info(&local_40,pcVar6 + -1);
  std::
  deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
  ::pop_back(&(this->context_stack_).c);
  pcVar6 = (this->context_stack_).c.
           super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pcVar6 != (this->context_stack_).c.
                super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (pcVar6 == (this->context_stack_).c.
                  super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pcVar6 = (this->context_stack_).c.
               super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
    }
    context_info::merge(pcVar6 + -1,&local_40);
  }
  if (0 < this->not_yet_shown_) {
    this->not_yet_shown_ = this->not_yet_shown_ + -1;
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void context_ended(const std::string& desc) override {
        progress_base::context_ended(desc);
        if (context_stack_.size() == 1 || context_stack_.top().total > context_stack_.top().skipped) {
          output_context_end_message();
        }
        const context_info context = context_stack_.top(); // copy
        context_stack_.pop();
        if (!context_stack_.empty()) {
          context_stack_.top().merge(context);
        }
        if (not_yet_shown_ > 0) {
          --not_yet_shown_;
        }
      }